

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O2

void __thiscall SceneRender::renderNormalBuffer(SceneRender *this,Uniforms *_uniforms)

{
  Fbo *pFVar1;
  mat4 *m2;
  Camera *_camera;
  Model *this_00;
  SceneRender *pSVar2;
  Shader *pSVar3;
  mat<4,_4,_float,_(glm::qualifier)0> *pmVar4;
  vec<3,_float,_(glm::qualifier)0> *v2;
  _Rb_tree_node_base *p_Var5;
  socklen_t in_ECX;
  sockaddr *in_RDX;
  allocator local_101;
  SceneRender *local_100;
  mat<4,_4,_float,_(glm::qualifier)0> local_f8;
  Tracker *local_b8;
  Fbo *local_b0;
  mat4 *local_a8;
  vec<3,_float,_(glm::qualifier)0> *local_a0;
  _Rb_tree_node_base *local_98;
  string local_90;
  mat<4,_4,_float,_(glm::qualifier)0> local_70;
  
  if ((this->normalFbo).m_allocated == true) {
    pFVar1 = &this->normalFbo;
    vera::Fbo::bind(pFVar1,(int)_uniforms,in_RDX,in_ECX);
    if (this->m_depth_test == true) {
      glEnable(0xb71);
    }
    _camera = (_uniforms->super_Scene).activeCamera;
    if (((_camera->super_Node).bChange != false) || ((this->m_origin).bChange == true)) {
      vera::setCamera(_camera);
      vera::applyMatrix(&(this->m_origin).m_transformMatrix);
    }
    local_100 = this;
    if (-1 < this->m_floor_subd_target) {
      std::__cxx11::string::string((string *)&local_f8,"normal",(allocator *)&local_70);
      pSVar3 = vera::Model::getBufferShader(&this->m_floor,(string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      if (pSVar3 != (Shader *)0x0) {
        if ((_uniforms->tracker).m_running == true) {
          std::__cxx11::string::string
                    ((string *)&local_f8,"render:sceneNormal:floor",(allocator *)&local_70);
          Tracker::begin(&_uniforms->tracker,(string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
        }
        vera::Shader::use(pSVar3);
        (*(_uniforms->super_Scene)._vptr_Scene[0x3e])(_uniforms,pSVar3,0);
        std::__cxx11::string::string((string *)&local_90,"u_modelViewProjectionMatrix",&local_101);
        vera::getProjectionViewWorldMatrix();
        m2 = &(local_100->m_floor).super_Node.m_transformMatrix;
        glm::operator*(&local_f8,&local_70,m2);
        vera::Shader::setUniform(pSVar3,&local_90,&local_f8,false);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::string((string *)&local_f8,"u_model",(allocator *)&local_90);
        local_70.value[0]._0_12_ =
             glm::operator+(&(local_100->m_origin).m_position,
                            &(local_100->m_floor).super_Node.m_position);
        vera::Shader::setUniform(pSVar3,(string *)&local_f8,(vec3 *)&local_70);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::string((string *)&local_70,"u_modelMatrix",(allocator *)&local_90);
        glm::operator*(&local_f8,&(local_100->m_origin).m_transformMatrix,m2);
        vera::Shader::setUniform(pSVar3,(string *)&local_70,&local_f8,false);
        std::__cxx11::string::~string((string *)&local_70);
        vera::Model::render(&this->m_floor,pSVar3);
        this = local_100;
        if ((_uniforms->tracker).m_running == true) {
          std::__cxx11::string::string
                    ((string *)&local_f8,"render:sceneNormal:floor",(allocator *)&local_70);
          Tracker::end(&_uniforms->tracker,(string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
        }
      }
    }
    local_b0 = pFVar1;
    vera::cullingMode(this->m_culling);
    local_98 = &(_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header;
    local_b8 = &_uniforms->tracker;
    local_a0 = &(this->m_origin).m_position;
    local_a8 = &(this->m_origin).m_transformMatrix;
    for (p_Var5 = (_uniforms->super_Scene).models._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left; pSVar2 = local_100, p_Var5 != local_98;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      this_00 = *(Model **)(p_Var5 + 2);
      std::__cxx11::string::string((string *)&local_f8,"normal",(allocator *)&local_70);
      pSVar3 = vera::Model::getBufferShader
                         (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      if (pSVar3 != (Shader *)0x0) {
        if ((_uniforms->tracker).m_running == true) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_f8,"render:sceneNormal:",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (*(long *)(p_Var5 + 2) + 0x2b0));
          Tracker::begin(local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
        }
        vera::Shader::use(pSVar3);
        (*(_uniforms->super_Scene)._vptr_Scene[0x3e])(_uniforms,pSVar3,0);
        std::__cxx11::string::string((string *)&local_90,"u_modelViewProjectionMatrix",&local_101);
        vera::getProjectionViewWorldMatrix();
        pmVar4 = (mat<4,_4,_float,_(glm::qualifier)0> *)
                 (**(code **)(**(long **)(p_Var5 + 2) + 0x100))();
        glm::operator*(&local_f8,&local_70,pmVar4);
        vera::Shader::setUniform(pSVar3,&local_90,(mat4 *)&local_f8,false);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::string((string *)&local_f8,"u_model",(allocator *)&local_90);
        v2 = (vec<3,_float,_(glm::qualifier)0> *)(**(code **)(**(long **)(p_Var5 + 2) + 0x98))();
        local_70.value[0]._0_12_ = glm::operator+(local_a0,v2);
        vera::Shader::setUniform
                  (pSVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_f8,(vec3 *)&local_70);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::string((string *)&local_70,"u_modelMatrix",(allocator *)&local_90);
        pmVar4 = (mat<4,_4,_float,_(glm::qualifier)0> *)
                 (**(code **)(**(long **)(p_Var5 + 2) + 0x100))();
        glm::operator*(&local_f8,local_a8,pmVar4);
        vera::Shader::setUniform(pSVar3,(string *)&local_70,(mat4 *)&local_f8,false);
        std::__cxx11::string::~string((string *)&local_70);
        vera::Model::render(*(Model **)(p_Var5 + 2),pSVar3);
        if ((_uniforms->tracker).m_running == true) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_f8,"render:sceneNormal:",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (*(long *)(p_Var5 + 2) + 0x2b0));
          Tracker::end(local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
        }
      }
    }
    if (local_100->m_depth_test != false) {
      glDisable(0xb71);
    }
    pFVar1 = local_b0;
    if (pSVar2->m_culling != CULL_NONE) {
      glDisable(0xb44);
    }
    vera::Fbo::unbind(pFVar1);
  }
  return;
}

Assistant:

void SceneRender::renderNormalBuffer(Uniforms& _uniforms) {
    if (!normalFbo.isAllocated())
        return;

    normalFbo.bind();

    // Begining of DEPTH for 3D 
    if (m_depth_test)
        glEnable(GL_DEPTH_TEST);

    if (_uniforms.activeCamera->bChange || m_origin.bChange) {
        vera::setCamera( _uniforms.activeCamera );
        vera::applyMatrix( m_origin.getTransformMatrix() );
    }

    vera::Shader* normalShader = nullptr;
    if (m_floor_subd_target >= 0) {
        normalShader = m_floor.getBufferShader("normal");
        if (normalShader != nullptr) {
            TRACK_BEGIN("render:sceneNormal:floor")
            normalShader->use();
            _uniforms.feedTo( normalShader, false );
            normalShader->setUniform("u_modelViewProjectionMatrix", vera::getProjectionViewWorldMatrix() * m_floor.getTransformMatrix());
            normalShader->setUniform("u_model", m_origin.getPosition() + m_floor.getPosition() );
            normalShader->setUniform("u_modelMatrix", m_origin.getTransformMatrix() * m_floor.getTransformMatrix() );
            m_floor.render(normalShader);
            TRACK_END("render:sceneNormal:floor")
        } 
    }

    vera::cullingMode(m_culling);

    for (vera::ModelsMap::iterator it = _uniforms.models.begin(); it != _uniforms.models.end(); ++it) {
        normalShader = it->second->getBufferShader("normal");
        if (normalShader != nullptr) {
            TRACK_BEGIN("render:sceneNormal:" + it->second->getName() )

            // bind the shader
            normalShader->use();

            // Update Uniforms and textures variables to the shader
            _uniforms.feedTo( normalShader, false );

            // Pass special uniforms
            normalShader->setUniform( "u_modelViewProjectionMatrix", vera::getProjectionViewWorldMatrix() * it->second->getTransformMatrix());
            normalShader->setUniform( "u_model", m_origin.getPosition() + it->second->getPosition() );
            normalShader->setUniform( "u_modelMatrix", m_origin.getTransformMatrix() * it->second->getTransformMatrix() );
            it->second->render(normalShader);

            TRACK_END("render:sceneNormal:" + it->second->getName() )
        }
    }

    if (m_depth_test)
        glDisable(GL_DEPTH_TEST);

    if (m_culling != 0)
        glDisable(GL_CULL_FACE);

    normalFbo.unbind();
}